

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_cursor.hpp
# Opt level: O2

type __thiscall
jsoncons::csv::basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>>::
reset<std::__cxx11::istringstream&>
          (basic_csv_cursor<char,jsoncons::stream_source<char>,std::allocator<char>> *this,
          basic_istringstream<char,_std::char_traits<char>,_std::allocator<char>_> *source)

{
  char cVar1;
  text_source_adaptor<jsoncons::stream_source<char>_> local_1b0;
  
  text_source_adaptor<jsoncons::stream_source<char>>::
  text_source_adaptor<std::__cxx11::istringstream&>
            ((text_source_adaptor<jsoncons::stream_source<char>> *)&local_1b0,source);
  text_source_adaptor<jsoncons::stream_source<char>_>::operator=
            ((text_source_adaptor<jsoncons::stream_source<char>_> *)(this + 8),&local_1b0);
  stream_source<char>::~stream_source(&local_1b0.source_);
  basic_csv_parser<char,_std::allocator<char>_>::reinitialize
            ((basic_csv_parser<char,_std::allocator<char>_> *)(this + 0x1a8));
  basic_staj_visitor<char>::reset((basic_staj_visitor<char> *)(this + 0x3a8));
  cVar1 = (**(code **)(*(long *)this + 0x18))(this);
  if (cVar1 == '\0') {
    (**(code **)(*(long *)this + 0x38))(this);
  }
  return;
}

Assistant:

typename std::enable_if<!std::is_constructible<jsoncons::basic_string_view<CharT>,Sourceable>::value>::type
    reset(Sourceable&& source)
    {
        source_ = std::forward<Sourceable>(source);
        parser_.reinitialize();
        cursor_visitor_.reset();
        if (!done())
        {
            next();
        }
    }